

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

void lws_wsi_mux_close_children(lws *wsi,int reason)

{
  undefined1 *puVar1;
  lws *plVar2;
  lws *obj;
  
  obj = (wsi->mux).child_list;
  if (obj != (lws *)0x0) {
    while (obj != (lws *)0x0) {
      _lws_log_cx((obj->lc).log_cx,lws_log_prepend_wsi,obj,8,"lws_wsi_mux_close_children",
                  "   closing child");
      plVar2 = (wsi->mux).child_list;
      obj = (plVar2->mux).sibling_list;
      if (obj == plVar2) {
        __assert_fail("wsi2 != *w",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/wsi.c"
                      ,0x57f,"void lws_wsi_mux_close_children(struct lws *, int)");
      }
      (plVar2->mux).sibling_list = (lws *)0x0;
      puVar1 = &((wsi->mux).child_list)->field_0x46e;
      *(ulong *)puVar1 = *(ulong *)puVar1 | 0x1000;
      __lws_close_free_wsi((wsi->mux).child_list,reason,"mux child recurse");
      (wsi->mux).child_list = obj;
    }
  }
  return;
}

Assistant:

void
lws_wsi_mux_close_children(struct lws *wsi, int reason)
{
	struct lws *wsi2;
	struct lws **w;

	if (!wsi->mux.child_list)
		return;

	w = &wsi->mux.child_list;
	while (*w) {
		lwsl_wsi_info((*w), "   closing child");
		/* disconnect from siblings */
		wsi2 = (*w)->mux.sibling_list;
		assert (wsi2 != *w);
		(*w)->mux.sibling_list = NULL;
		(*w)->socket_is_permanently_unusable = 1;
		__lws_close_free_wsi(*w, (enum lws_close_status)reason, "mux child recurse");
		*w = wsi2;
	}
}